

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int32 iVar1;
  uint uVar2;
  long lVar3;
  FieldDescriptorProto *pFVar4;
  OneofDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *pDVar5;
  DescriptorProto_ReservedRange *pDVar6;
  MessageOptions *pMVar7;
  MessageOptions *pMVar8;
  int i;
  long lVar9;
  int i_4;
  long lVar10;
  int i_7;
  
  DescriptorProto::set_name(proto,*(string **)this);
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x2c); lVar9 = lVar9 + 1) {
    lVar3 = *(long *)(this + 0x30);
    pFVar4 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->field_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar3 + lVar10),pFVar4);
    lVar10 = lVar10 + 0xa8;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x38); lVar9 = lVar9 + 1) {
    lVar3 = *(long *)(this + 0x40);
    proto_00 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Add(&proto->oneof_decl_);
    OneofDescriptor::CopyTo((OneofDescriptor *)(lVar3 + lVar10),proto_00);
    lVar10 = lVar10 + 0x30;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x48); lVar9 = lVar9 + 1) {
    lVar3 = *(long *)(this + 0x50);
    proto_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&proto->nested_type_);
    CopyTo((Descriptor *)(lVar3 + lVar10),proto_01);
    lVar10 = lVar10 + 0xa8;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x58); lVar9 = lVar9 + 1) {
    lVar3 = *(long *)(this + 0x60);
    proto_02 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&proto->enum_type_);
    EnumDescriptor::CopyTo((EnumDescriptor *)(lVar3 + lVar10),proto_02);
    lVar10 = lVar10 + 0x38;
  }
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x68); lVar9 = lVar9 + 1) {
    pDVar5 = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                       (&proto->extension_range_);
    lVar10 = *(long *)(this + 0x70);
    iVar1 = *(int32 *)(lVar10 + lVar9 * 8);
    uVar2 = (pDVar5->_has_bits_).has_bits_[0];
    (pDVar5->_has_bits_).has_bits_[0] = uVar2 | 1;
    pDVar5->start_ = iVar1;
    iVar1 = *(int32 *)(lVar10 + 4 + lVar9 * 8);
    (pDVar5->_has_bits_).has_bits_[0] = uVar2 | 3;
    pDVar5->end_ = iVar1;
  }
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x78); lVar9 = lVar9 + 1) {
    lVar3 = *(long *)(this + 0x80);
    pFVar4 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->extension_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar3 + lVar10),pFVar4);
    lVar10 = lVar10 + 0xa8;
  }
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x88); lVar9 = lVar9 + 1) {
    pDVar6 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add
                       (&proto->reserved_range_);
    lVar10 = *(long *)(this + 0x90);
    iVar1 = *(int32 *)(lVar10 + lVar9 * 8);
    uVar2 = (pDVar6->_has_bits_).has_bits_[0];
    (pDVar6->_has_bits_).has_bits_[0] = uVar2 | 1;
    pDVar6->start_ = iVar1;
    iVar1 = *(int32 *)(lVar10 + 4 + lVar9 * 8);
    (pDVar6->_has_bits_).has_bits_[0] = uVar2 | 3;
    pDVar6->end_ = iVar1;
  }
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x98); lVar9 = lVar9 + 1) {
    DescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0xa0) + lVar9 * 8));
  }
  pMVar8 = *(MessageOptions **)(this + 0x20);
  pMVar7 = MessageOptions::default_instance();
  if (pMVar8 != pMVar7) {
    pMVar8 = DescriptorProto::mutable_options(proto);
    MessageOptions::CopyFrom(pMVar8,*(MessageOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    DescriptorProto::ExtensionRange* range = proto->add_extension_range();
    range->set_start(extension_range(i)->start);
    range->set_end(extension_range(i)->end);
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}